

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dthinker.cpp
# Opt level: O0

int AF_DThinkerIterator_Create
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  VMValue *pVVar1;
  DThinkerIterator *this;
  TArray<VMValue,_VMValue> *len;
  bool bVar2;
  DThinkerIterator *state;
  PClass *pPStack_40;
  int statnum;
  MetaClass *type;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  TArray<VMValue,_VMValue> *defaultparam_local;
  VMValue *param_local;
  
  if (numparam < 1) {
    pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,0);
    bVar2 = false;
    if ((pVVar1->field_0).field_3.Type == '\x03') {
      pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,0);
      bVar2 = true;
      if ((pVVar1->field_0).field_1.atag != 1) {
        pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,0);
        bVar2 = (pVVar1->field_0).field_1.a == (void *)0x0;
      }
    }
    if (!bVar2) {
      __assert_fail("(defaultparam[paramnum]).Type == REGT_POINTER && ((defaultparam[paramnum]).atag == ATAG_OBJECT || (defaultparam[paramnum]).a == nullptr)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dthinker.cpp"
                    ,0x2d1,
                    "int AF_DThinkerIterator_Create(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    len = (TArray<VMValue,_VMValue> *)0x0;
    pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,0);
    pPStack_40 = (PClass *)(pVVar1->field_0).field_1.a;
  }
  else {
    bVar2 = false;
    if (((param->field_0).field_3.Type == '\x03') &&
       (bVar2 = true, (param->field_0).field_1.atag != 1)) {
      bVar2 = (param->field_0).field_1.a == (void *)0x0;
    }
    if (!bVar2) {
      __assert_fail("(param[paramnum]).Type == REGT_POINTER && ((param[paramnum]).atag == ATAG_OBJECT || (param[paramnum]).a == nullptr)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dthinker.cpp"
                    ,0x2d1,
                    "int AF_DThinkerIterator_Create(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    pPStack_40 = (PClass *)(param->field_0).field_1.a;
    len = defaultparam;
  }
  if (numparam < 2) {
    pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,1);
    if ((pVVar1->field_0).field_3.Type != '\0') {
      __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dthinker.cpp"
                    ,0x2d2,
                    "int AF_DThinkerIterator_Create(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    len = (TArray<VMValue,_VMValue> *)0x1;
    pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,1);
    state._4_4_ = (pVVar1->field_0).i;
  }
  else {
    if (param[1].field_0.field_3.Type != '\0') {
      __assert_fail("(param[paramnum]).Type == REGT_INT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dthinker.cpp"
                    ,0x2d2,
                    "int AF_DThinkerIterator_Create(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    state._4_4_ = param[1].field_0.i;
  }
  this = (DThinkerIterator *)DObject::operator_new((DObject *)0x40,(size_t)len);
  DThinkerIterator::DThinkerIterator(this,pPStack_40,state._4_4_);
  if (numret < 1) {
    param_local._4_4_ = 0;
  }
  else {
    if (ret == (VMReturn *)0x0) {
      __assert_fail("ret != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dthinker.cpp"
                    ,0x2d3,
                    "int AF_DThinkerIterator_Create(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    VMReturn::SetPointer(ret,this,1);
    param_local._4_4_ = 1;
  }
  return param_local._4_4_;
}

Assistant:

DEFINE_ACTION_FUNCTION(DThinkerIterator, Create)
{
	PARAM_PROLOGUE;
	PARAM_CLASS_DEF(type, DThinker);
	PARAM_INT_DEF(statnum);
	ACTION_RETURN_OBJECT(new DThinkerIterator(type, statnum));
}